

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_test.cpp
# Opt level: O0

void check_all(void)

{
  ostream *poVar1;
  runtime_error *this;
  ostringstream oss;
  size_t j;
  char *s;
  size_t size;
  char c;
  size_t pos;
  string local_1d0 [48];
  ostringstream local_1a0 [376];
  ulong local_28;
  void *local_20;
  ulong local_18;
  char local_9;
  ulong local_8;
  
  local_8 = 0;
  do {
    if (99 < local_8) {
      return;
    }
    if (memory[local_8] != (void *)0x0) {
      local_9 = vals[local_8];
      local_18 = sizes[local_8];
      local_20 = memory[local_8];
      for (local_28 = 0; local_28 < local_18; local_28 = local_28 + 1) {
        if (*(char *)((long)local_20 + local_28) != local_9) {
          std::__cxx11::ostringstream::ostringstream(local_1a0);
          poVar1 = std::operator<<((ostream *)local_1a0,"Error ");
          poVar1 = std::operator<<(poVar1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/allocator_test.cpp"
                                  );
          poVar1 = std::operator<<(poVar1,":");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x23);
          std::operator<<(poVar1," s[j]==c");
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::str();
          std::runtime_error::runtime_error(this,local_1d0);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    local_8 = local_8 + 1;
  } while( true );
}

Assistant:

void check_all()
{
	for(size_t pos = 0;pos < objects;pos++) {
		if(!memory[pos])
			continue;
		char c=vals[pos];
		size_t size = sizes[pos]; 
		char *s = static_cast<char *>(memory[pos]);
		for(size_t j=0;j<size;j++) {
			TEST(s[j]==c);
		}
	}
}